

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_masked_sprite_24px(tgestate_t *state,vischar_t *vischar)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  long in_RSI;
  tgestate_t *in_RDI;
  int carry_out_48;
  int carry_out_47;
  int carry_out_46;
  int carry_out_45;
  int carry_out_44;
  int carry_out_43;
  int carry_out_42;
  int carry_out_41;
  int carry_out_40;
  int carry_out_39;
  int carry_out_38;
  int carry_out_37;
  int carry_out_36;
  int carry_out_35;
  int carry_out_34;
  int carry_out_33;
  int carry_out_32;
  int carry_out_31;
  int carry_out_30;
  int carry_out_29;
  int carry_out_28;
  int carry_out_27;
  int carry_out_26;
  int carry_out_25;
  int carry_out_24;
  int carry_out_23;
  int carry_out_22;
  int carry_out_21;
  int carry_1;
  uint8_t mask3_1;
  uint8_t mask2_1;
  uint8_t mask1_1;
  uint8_t mask0_1;
  uint8_t bm3_1;
  uint8_t bm2_1;
  uint8_t bm1_1;
  uint8_t bm0_1;
  int carry_out_20;
  int carry_out_19;
  int carry_out_18;
  int carry_out_17;
  int carry_out_16;
  int carry_out_15;
  int carry_out_14;
  int carry_out_13;
  int carry_out_12;
  int carry_out_11;
  int carry_out_10;
  int carry_out_9;
  int carry_out_8;
  int carry_out_7;
  int carry_out_6;
  int carry_out_5;
  int carry_out_4;
  int carry_out_3;
  int carry_out_2;
  int carry_out_1;
  int carry_out;
  int carry;
  uint8_t mask3;
  uint8_t mask2;
  uint8_t mask1;
  uint8_t mask0;
  uint8_t bm3;
  uint8_t bm2;
  uint8_t bm1;
  uint8_t bm0;
  uint8_t *screenptr;
  uint8_t *foremaskptr;
  uint8_t *bitmapptr;
  uint8_t *maskptr;
  uint8_t iters;
  uint8_t x;
  byte local_a4;
  byte local_a0;
  byte local_9f;
  byte local_9e;
  byte local_9d;
  byte local_9c;
  byte local_9b;
  byte local_9a;
  byte local_99;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  undefined4 local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined4 local_68;
  uint local_64;
  uint local_60;
  undefined4 local_5c;
  uint local_58;
  uint local_54;
  undefined4 local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  byte *local_38;
  byte *local_30;
  byte *local_28;
  byte *local_20;
  uint8_t local_12;
  byte local_11;
  tgestate_t *local_8;
  
  local_11 = (byte)*(undefined2 *)(in_RSI + 0x38) & 7;
  local_8 = in_RDI;
  if (local_11 < 4) {
    local_11 = (local_11 ^ 0xff) & 3;
    local_20 = in_RDI->mask_pointer;
    local_28 = in_RDI->bitmap_pointer;
    local_12 = (in_RDI->spriteplotter).height_24_right;
    do {
      local_44 = 0;
      local_39 = *local_28;
      pbVar3 = local_28 + 2;
      local_3a = local_28[1];
      local_28 = local_28 + 3;
      local_3b = *pbVar3;
      local_3d = *local_20;
      pbVar3 = local_20 + 2;
      local_3e = local_20[1];
      local_20 = local_20 + 3;
      local_3f = *pbVar3;
      if ((local_8->sprite_index & 0x80) != 0) {
        flip_24_masked_pixels(local_8,&local_3f,&local_3e,&local_3d,&local_3b,&local_3a,&local_39);
      }
      local_30 = local_8->foreground_mask_pointer;
      local_38 = local_8->window_buf_pointer;
      local_3c = 0;
      if (local_11 == 0) {
        local_48 = local_3a & 1;
        local_3a = (byte)((int)(uint)local_3a >> 1) | local_39 << 7;
        local_4c = local_3b & 1;
        local_3b = (byte)((int)(uint)local_3b >> 1) | (byte)(local_48 << 7);
        local_50 = 0;
        local_3c = (byte)(local_4c << 7);
        local_39 = (byte)((int)(uint)local_39 >> 1);
      }
      if (local_11 < 2) {
        local_54 = local_3a & 1;
        local_3a = (byte)((int)(uint)local_3a >> 1) | local_39 << 7;
        local_58 = local_3b & 1;
        local_3b = (byte)((int)(uint)local_3b >> 1) | (byte)(local_54 << 7);
        local_5c = 0;
        local_3c = (byte)((int)(uint)local_3c >> 1) | (byte)(local_58 << 7);
        local_39 = (byte)((int)(uint)local_39 >> 1);
      }
      if (local_11 < 3) {
        local_60 = local_3a & 1;
        local_3a = (byte)((int)(uint)local_3a >> 1) | local_39 << 7;
        local_64 = local_3b & 1;
        local_3b = (byte)((int)(uint)local_3b >> 1) | (byte)(local_60 << 7);
        local_68 = 0;
        local_3c = (byte)((int)(uint)local_3c >> 1) | (byte)(local_64 << 7);
        local_39 = (byte)((int)(uint)local_39 >> 1);
      }
      local_40 = 0xff;
      if (local_11 == 0) {
        local_6c = local_3d & 1;
        local_3d = (byte)((int)(uint)local_3d >> 1) | 0x80;
        local_70 = local_3e & 1;
        local_3e = (byte)((int)(uint)local_3e >> 1) | (byte)(local_6c << 7);
        local_74 = local_3f & 1;
        local_3f = (byte)((int)(uint)local_3f >> 1) | (byte)(local_70 << 7);
        local_78 = 1;
        local_40 = (byte)(local_74 << 7) | 0x7f;
      }
      local_44 = 1;
      if (local_11 < 2) {
        local_7c = local_3d & 1;
        local_3d = (byte)((int)(uint)local_3d >> 1) | 0x80;
        local_80 = local_3e & 1;
        local_3e = (byte)((int)(uint)local_3e >> 1) | (byte)(local_7c << 7);
        local_84 = local_3f & 1;
        local_3f = (byte)((int)(uint)local_3f >> 1) | (byte)(local_80 << 7);
        local_88 = local_40 & 1;
        local_40 = (byte)((int)(uint)local_40 >> 1) | (byte)(local_84 << 7);
        local_44 = local_88;
      }
      if (local_11 < 3) {
        local_8c = local_3d & 1;
        local_3d = (byte)((int)(uint)local_3d >> 1) | (byte)(local_44 << 7);
        local_90 = local_3e & 1;
        local_3e = (byte)((int)(uint)local_3e >> 1) | (byte)(local_8c << 7);
        local_94 = local_3f & 1;
        local_3f = (byte)((int)(uint)local_3f >> 1) | (byte)(local_90 << 7);
        local_98 = local_40 & 1;
        local_40 = (byte)((int)(uint)local_40 >> 1) | (byte)(local_94 << 7);
      }
      if ((local_8->spriteplotter).enable_24_right_1 != '\0') {
        *local_38 = (*local_30 ^ 0xff | local_3d) & *local_38 | local_39 & *local_30;
      }
      if ((local_8->spriteplotter).enable_24_right_2 != '\0') {
        local_38[1] = (local_30[1] ^ 0xff | local_3e) & local_38[1] | local_3a & local_30[1];
      }
      if ((local_8->spriteplotter).enable_24_right_3 != '\0') {
        local_38[2] = (local_30[2] ^ 0xff | local_3f) & local_38[2] | local_3b & local_30[2];
      }
      local_38 = local_38 + 3;
      if ((local_8->spriteplotter).enable_24_right_4 != '\0') {
        *local_38 = (local_30[3] ^ 0xff | local_40) & *local_38 | local_3c & local_30[3];
      }
      local_30 = local_30 + 4;
      local_8->foreground_mask_pointer = local_30;
      local_38 = local_38 + (local_8->columns + -3);
      local_8->window_buf_pointer = local_38;
      local_12 = local_12 + 0xff;
    } while (local_12 != '\0');
  }
  else {
    local_11 = local_11 - 4;
    local_20 = in_RDI->mask_pointer;
    local_28 = in_RDI->bitmap_pointer;
    local_12 = (in_RDI->spriteplotter).height_24_left;
    do {
      local_9b = *local_28;
      pbVar3 = local_28 + 2;
      local_9a = local_28[1];
      local_28 = local_28 + 3;
      local_99 = *pbVar3;
      local_9f = *local_20;
      pbVar3 = local_20 + 2;
      local_9e = local_20[1];
      local_20 = local_20 + 3;
      local_9d = *pbVar3;
      if ((local_8->sprite_index & 0x80) != 0) {
        flip_24_masked_pixels(local_8,&local_9d,&local_9e,&local_9f,&local_99,&local_9a,&local_9b);
      }
      local_30 = local_8->foreground_mask_pointer;
      local_38 = local_8->window_buf_pointer;
      local_9c = 0;
      if (local_11 == 0) {
        uVar1 = (uint)local_99;
        local_99 = local_99 << 1;
        uVar2 = (uint)local_9a;
        local_9a = local_9a << 1 | (byte)((int)uVar1 >> 7);
        uVar1 = (uint)local_9b;
        local_9b = local_9b << 1 | (byte)((int)uVar2 >> 7);
        local_9c = (byte)((int)uVar1 >> 7);
      }
      if (local_11 < 2) {
        uVar1 = (uint)local_99;
        local_99 = local_99 << 1;
        uVar2 = (uint)local_9a;
        local_9a = local_9a << 1 | (byte)((int)uVar1 >> 7);
        uVar1 = (uint)local_9b;
        local_9b = local_9b << 1 | (byte)((int)uVar2 >> 7);
        local_9c = local_9c << 1 | (byte)((int)uVar1 >> 7);
      }
      if (local_11 < 3) {
        uVar1 = (uint)local_99;
        local_99 = local_99 << 1;
        uVar2 = (uint)local_9a;
        local_9a = local_9a << 1 | (byte)((int)uVar1 >> 7);
        uVar1 = (uint)local_9b;
        local_9b = local_9b << 1 | (byte)((int)uVar2 >> 7);
        local_9c = local_9c << 1 | (byte)((int)uVar1 >> 7);
      }
      if (local_11 < 4) {
        uVar1 = (uint)local_99;
        local_99 = local_99 << 1;
        uVar2 = (uint)local_9a;
        local_9a = local_9a << 1 | (byte)((int)uVar1 >> 7);
        uVar1 = (uint)local_9b;
        local_9b = local_9b << 1 | (byte)((int)uVar2 >> 7);
        local_9c = local_9c << 1 | (byte)((int)uVar1 >> 7);
      }
      local_a0 = 0xff;
      if (local_11 == 0) {
        uVar1 = (uint)local_9d;
        local_9d = local_9d << 1 | 1;
        uVar2 = (uint)local_9e;
        local_9e = local_9e << 1 | (byte)((int)uVar1 >> 7);
        uVar1 = (uint)local_9f;
        local_9f = local_9f << 1 | (byte)((int)uVar2 >> 7);
        local_a0 = (byte)((int)uVar1 >> 7) | 0xfe;
      }
      local_a4 = 1;
      if (local_11 < 2) {
        uVar1 = (uint)local_9d;
        local_9d = local_9d << 1 | 1;
        uVar2 = (uint)local_9e;
        local_9e = local_9e << 1 | (byte)((int)uVar1 >> 7);
        uVar1 = (uint)local_9f;
        local_9f = local_9f << 1 | (byte)((int)uVar2 >> 7);
        local_a4 = (byte)((int)(uint)local_a0 >> 7);
        local_a0 = local_a0 << 1 | (byte)((int)uVar1 >> 7);
      }
      if (local_11 < 3) {
        uVar1 = (uint)local_9d;
        local_9d = local_9d << 1 | local_a4;
        uVar2 = (uint)local_9e;
        local_9e = local_9e << 1 | (byte)((int)uVar1 >> 7);
        uVar1 = (uint)local_9f;
        local_9f = local_9f << 1 | (byte)((int)uVar2 >> 7);
        local_a4 = (byte)((int)(uint)local_a0 >> 7);
        local_a0 = local_a0 << 1 | (byte)((int)uVar1 >> 7);
      }
      if (local_11 < 4) {
        uVar1 = (uint)local_9d;
        local_9d = local_9d << 1 | local_a4;
        uVar2 = (uint)local_9e;
        local_9e = local_9e << 1 | (byte)((int)uVar1 >> 7);
        uVar1 = (uint)local_9f;
        local_9f = local_9f << 1 | (byte)((int)uVar2 >> 7);
        local_a0 = local_a0 << 1 | (byte)((int)uVar1 >> 7);
      }
      if ((local_8->spriteplotter).enable_24_left_1 != '\0') {
        *local_38 = (*local_30 ^ 0xff | local_a0) & *local_38 | local_9c & *local_30;
      }
      if ((local_8->spriteplotter).enable_24_left_2 != '\0') {
        local_38[1] = (local_30[1] ^ 0xff | local_9f) & local_38[1] | local_9b & local_30[1];
      }
      if ((local_8->spriteplotter).enable_24_left_3 != '\0') {
        local_38[2] = (local_30[2] ^ 0xff | local_9e) & local_38[2] | local_9a & local_30[2];
      }
      local_38 = local_38 + 3;
      if ((local_8->spriteplotter).enable_24_left_4 != '\0') {
        *local_38 = (local_30[3] ^ 0xff | local_9d) & *local_38 | local_99 & local_30[3];
      }
      local_30 = local_30 + 4;
      local_8->foreground_mask_pointer = local_30;
      local_38 = local_38 + (local_8->columns + -3);
      local_8->window_buf_pointer = local_38;
      local_12 = local_12 + 0xff;
    } while (local_12 != '\0');
  }
  return;
}

Assistant:

void plot_masked_sprite_24px(tgestate_t *state, vischar_t *vischar)
{
  uint8_t        x;           /* was A */
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if ((x = (vischar->isopos.x & 7)) < 4)
  {
    /* Shift right */

    x = ~x & 3; /* jump table offset (on input, x is 0..3) */

    maskptr   = state->mask_pointer;
    bitmapptr = state->bitmap_pointer;

    assert(maskptr   != NULL);
    assert(bitmapptr != NULL);

    iters = state->spriteplotter.height_24_right;
    assert(iters <= MASK_BUFFER_HEIGHT * 8);
    do
    {
      uint8_t bm0, bm1, bm2, bm3;         /* was B, C, E, D */
      uint8_t mask0, mask1, mask2, mask3; /* was B', C', E', D' */
      int     carry = 0;                  /* was flags */

      /* Load bitmap bytes into B,C,E. */
      bm0 = *bitmapptr++;
      bm1 = *bitmapptr++;
      bm2 = *bitmapptr++;

      /* Load mask bytes into B',C',E'. */
      mask0 = *maskptr++;
      mask1 = *maskptr++;
      mask2 = *maskptr++;

      if (state->sprite_index & sprite_FLAG_FLIP)
        flip_24_masked_pixels(state, &mask2, &mask1, &mask0, &bm2, &bm1, &bm0);

      foremaskptr = state->foreground_mask_pointer;
      screenptr   = state->window_buf_pointer; /* Conv: Moved compared to the other routines. */

      ASSERT_MASK_BUF_PTR_VALID(foremaskptr);
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);

      /* Shift bitmap */

      bm3 = 0;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }
      if (x <= 1)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }
      if (x <= 2)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }

      /* Shift mask */

      mask3 = 0xFF;
      carry = 1;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }
      if (x <= 1)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }
      if (x <= 2)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }

      /* Plot, using foreground mask. */

      /* Conv: We form 'mask' inside of the enable_* condition. The original
       * game got away with accessing out-of-bounds memory but we can't. */

      if (state->spriteplotter.enable_24_right_1)
        *screenptr = MASK(bm0, mask0);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_2)
        *screenptr = MASK(bm1, mask1);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_3)
        *screenptr = MASK(bm2, mask2);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_4)
        *screenptr = MASK(bm3, mask3);
      foremaskptr++;
      state->foreground_mask_pointer = foremaskptr;

      screenptr += state->columns - 3; /* was 21 */
      if (iters > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);
      state->window_buf_pointer = screenptr;
    }
    while (--iters);
  }
  else
  {
    /* Shift left */

    x -= 4; /* jump table offset (on input, x is 4..7) */

    maskptr   = state->mask_pointer;
    bitmapptr = state->bitmap_pointer;

    assert(maskptr   != NULL);
    assert(bitmapptr != NULL);

    iters = state->spriteplotter.height_24_left;
    assert(iters <= MASK_BUFFER_HEIGHT * 8);
    do
    {
      /* Note the different variable order to the case above. */
      uint8_t bm0, bm1, bm2, bm3;         /* was E, C, B, D */
      uint8_t mask0, mask1, mask2, mask3; /* was E', C', B', D' */
      int     carry = 0;

      /* Load bitmap bytes into B,C,E. */
      bm2 = *bitmapptr++;
      bm1 = *bitmapptr++;
      bm0 = *bitmapptr++;

      /* Load mask bytes into B',C',E'. */
      mask2 = *maskptr++;
      mask1 = *maskptr++;
      mask0 = *maskptr++;

      if (state->sprite_index & sprite_FLAG_FLIP)
        flip_24_masked_pixels(state, &mask0, &mask1, &mask2, &bm0, &bm1, &bm2);

      foremaskptr = state->foreground_mask_pointer;
      screenptr   = state->window_buf_pointer;

      ASSERT_MASK_BUF_PTR_VALID(foremaskptr);
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);

      /* Shift bitmap bytes */

      bm3 = 0;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 1)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 2)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 3)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }

      /* Shift mask bytes */

      mask3 = 0xFF; /* all bits set => mask off */
      carry = 1; /* mask off */
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 1)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 2)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 3)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }

      /* Plot, using foreground mask. */

      /* Conv: We form 'mask' inside of the enable_* condition. The original
       * game got away with accessing out-of-bounds memory but we can't. */

      if (state->spriteplotter.enable_24_left_1)
        *screenptr = MASK(bm3, mask3);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_2)
        *screenptr = MASK(bm2, mask2);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_3)
        *screenptr = MASK(bm1, mask1);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_4)
        *screenptr = MASK(bm0, mask0);
      foremaskptr++;
      state->foreground_mask_pointer = foremaskptr;

      screenptr += state->columns - 3; /* was 21 */
      if (iters > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);
      state->window_buf_pointer = screenptr;
    }
    while (--iters);
  }
}